

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O0

void __thiscall IRCCommand::IRCCommand(IRCCommand *this)

{
  IRCCommand *local_18;
  IRCCommand *local_10;
  IRCCommand *this_local;
  
  local_10 = this;
  Jupiter::Command::Command(&this->super_Command);
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_00157b88;
  std::vector<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>::vector
            (&this->m_types);
  std::vector<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>::vector
            (&this->m_channels);
  this->m_access = 0;
  local_18 = this;
  std::vector<IRCCommand_*,_std::allocator<IRCCommand_*>_>::push_back
            (&g_IRCMasterCommandList,&local_18);
  return;
}

Assistant:

IRCCommand::IRCCommand() {
	m_access = 0;
	IRCMasterCommandList.push_back(this);
}